

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::generateTestRequest(Session *this,string *id)

{
  allocator<char> local_1e1;
  STRING local_1e0;
  TestReqID testReqID;
  Message testRequest;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"1",&local_1e1);
  MsgType::MsgType((MsgType *)&testReqID,&local_1e0);
  newMessage(&testRequest,this,(MsgType *)&testReqID);
  FieldBase::~FieldBase((FieldBase *)&testReqID);
  std::__cxx11::string::~string((string *)&local_1e0);
  fill(this,&testRequest.m_header);
  TestReqID::TestReqID(&testReqID,id);
  FieldMap::setField(&testRequest.super_FieldMap,(FieldBase *)&testReqID,true);
  sendRaw(this,&testRequest,0);
  FieldBase::~FieldBase((FieldBase *)&testReqID);
  Message::~Message(&testRequest);
  return;
}

Assistant:

void Session::generateTestRequest(const std::string &id) {
  Message testRequest = newMessage(MsgType(MsgType_TestRequest));

  fill(testRequest.getHeader());
  TestReqID testReqID(id);
  testRequest.setField(testReqID);

  sendRaw(testRequest);
}